

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall Printer_prettyPrintRandom_Test::TestBody(Printer_prettyPrintRandom_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  string equation5;
  AssertionResult gtest_ar;
  ComponentPtr component5;
  ModelPtr model;
  PrinterPtr printer;
  AssertHelper aAStack_98 [8];
  long *local_90 [2];
  long local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  bool local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Printer::create();
  libcellml::Model::create();
  psVar1 = local_30;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"component","");
  libcellml::Component::create((string *)&local_40);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_30);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\"><apply>          <eq/><apply><diff/><bvar><ci>   t\n\n\t\t</ci></bvar>\n\n<ci>X</ci></apply><apply><minus/><apply><times/><ci>     alpha_X</ci>             \n<apply><minus/>\n\n\n<cn cellml:units=\"dimensionless\">1</cn><ci>X     </ci></apply></apply><apply><times/><ci>beta_X</ci><ci>X</ci></apply>\n\n\n</apply></apply></math>"
             ,"");
  libcellml::Component::setMath(local_40);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_70,local_20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_50,"PRETTY_MODEL_STRING","printer->printModel(model)",
             &PRETTY_MODEL_STRING_abi_cxx11_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x3b1,pcVar3);
    testing::internal::AssertHelper::operator=(aAStack_98,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(aAStack_98);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Printer, prettyPrintRandom)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component5 = libcellml::Component::create("component");
    model->addComponent(component5);
    const std::string equation5 =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\"><apply>          "
        "<eq/><apply><diff/><bvar><ci>   t\n\n\t\t</ci></bvar>\n\n<ci>X</ci></apply>"
        "<apply><minus/><apply><times/><ci>     alpha_X</ci>             \n<apply><minus/>\n\n\n"
        "<cn cellml:units=\"dimensionless\">1</cn><ci>X     </ci></apply></apply><apply><times/>"
        "<ci>beta_X</ci><ci>X</ci></apply>\n\n\n</apply></apply></math>";
    component5->setMath(equation5);

    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}